

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

ReflectionSchema * __thiscall
google::protobuf::anon_unknown_0::MigrationToReflectionSchema
          (ReflectionSchema *__return_storage_ptr__,anon_unknown_0 *this,Message **default_instance,
          uint32 *offsets,MigrationSchema migration_schema)

{
  uint32 *offsets_local;
  Message **default_instance_local;
  MigrationSchema migration_schema_local;
  
  __return_storage_ptr__->default_instance_ = *(Message **)this;
  migration_schema_local.offsets_index = (int32)offsets;
  __return_storage_ptr__->offsets_ =
       (uint32 *)((long)default_instance + (long)migration_schema_local.offsets_index * 4 + 0x14);
  migration_schema_local.has_bit_indices_index = (int32)((ulong)offsets >> 0x20);
  __return_storage_ptr__->has_bit_indices_ =
       (uint32 *)((long)default_instance + (long)migration_schema_local.has_bit_indices_index * 4);
  __return_storage_ptr__->has_bits_offset_ =
       *(int *)((long)default_instance + (long)migration_schema_local.offsets_index * 4);
  __return_storage_ptr__->metadata_offset_ =
       *(int *)((long)default_instance + (long)(migration_schema_local.offsets_index + 1) * 4);
  __return_storage_ptr__->extensions_offset_ =
       *(int *)((long)default_instance + (long)(migration_schema_local.offsets_index + 2) * 4);
  __return_storage_ptr__->oneof_case_offset_ =
       *(int *)((long)default_instance + (long)(migration_schema_local.offsets_index + 3) * 4);
  __return_storage_ptr__->object_size_ = migration_schema.offsets_index;
  __return_storage_ptr__->weak_field_map_offset_ =
       *(int *)((long)default_instance + (long)(migration_schema_local.offsets_index + 4) * 4);
  return __return_storage_ptr__;
}

Assistant:

ReflectionSchema MigrationToReflectionSchema(
    const Message* const* default_instance, const uint32* offsets,
    MigrationSchema migration_schema) {
  ReflectionSchema result;
  result.default_instance_ = *default_instance;
  // First 6 offsets are offsets to the special fields. The following offsets
  // are the proto fields.
  result.offsets_ = offsets + migration_schema.offsets_index + 5;
  result.has_bit_indices_ = offsets + migration_schema.has_bit_indices_index;
  result.has_bits_offset_ = offsets[migration_schema.offsets_index + 0];
  result.metadata_offset_ = offsets[migration_schema.offsets_index + 1];
  result.extensions_offset_ = offsets[migration_schema.offsets_index + 2];
  result.oneof_case_offset_ = offsets[migration_schema.offsets_index + 3];
  result.object_size_ = migration_schema.object_size;
  result.weak_field_map_offset_ = offsets[migration_schema.offsets_index + 4];
  return result;
}